

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void nuts_tran_duplicate_listen(char *scheme)

{
  _Bool _Var1;
  nng_err nVar2;
  int iVar3;
  nng_err num;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  nng_url *local_48;
  nng_url *url;
  nng_listener local_38;
  nng_listener l2;
  nng_listener l1;
  nng_socket s;
  
  l2.id = 0;
  local_38.id = 0;
  url._4_4_ = 0;
  pcVar5 = strchr(scheme,0x36);
  if (pcVar5 != (char *)0x0) {
    _Var1 = nuts_has_ipv6();
    if (!_Var1) {
      acutest_skip_("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                    ,0x127,"No IPv6 support present");
      return;
    }
  }
  nuts_scratch_addr_zero(scheme,0x40,nuts_tran_duplicate_listen::nuts_addr_);
  nVar2 = nng_pair1_open((nng_socket *)&l2);
  pcVar5 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                         ,0x129,"%s: expected success, got %s (%d)","nng_pair1_open(&(s))",pcVar5,
                         nVar2);
  if (iVar3 != 0) {
    nVar2 = nng_listen((nng_socket)l2.id,nuts_tran_duplicate_listen::nuts_addr_,&local_38,0);
    pcVar5 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x12a,"%s: expected success, got %s (%d)","nng_listen(s, addr, &l1, 0)",
                           pcVar5,nVar2);
    if (iVar3 != 0) {
      nVar2 = nng_listener_get_url(local_38,&local_48);
      pcVar5 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                             ,299,"%s: expected success, got %s (%d)",
                             "nng_listener_get_url(l1, &url)",pcVar5,nVar2);
      if (iVar3 != 0) {
        num = nng_listen_url((nng_socket)l2.id,local_48,(nng_listener *)((long)&url + 4),0);
        pcVar5 = nng_strerror(NNG_EADDRINUSE);
        acutest_check_((uint)(num == NNG_EADDRINUSE),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                       ,300,"%s fails with %s","nng_listen_url(s, url, &l2, 0)",pcVar5,nVar2);
        pcVar5 = nng_strerror(NNG_EADDRINUSE);
        pcVar6 = nng_strerror(num);
        acutest_message_("%s: expected %s (%d), got %s (%d)","nng_listen_url(s, url, &l2, 0)",pcVar5
                         ,10,pcVar6,(ulong)num);
        iVar3 = nng_listener_id(local_38);
        acutest_check_((uint)(0 < iVar3),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                       ,0x12d,"%s","nng_listener_id(l1) > 0");
        uVar4 = nng_listener_id(url._4_4_);
        acutest_check_(uVar4 >> 0x1f,
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                       ,0x12e,"%s","nng_listener_id(l2) < 0");
        nVar2 = nng_socket_close((nng_socket)l2.id);
        pcVar5 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                               ,0x12f,"%s: expected success, got %s (%d)","nng_socket_close(s)",
                               pcVar5,nVar2);
        if (iVar3 != 0) {
          return;
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
nuts_tran_duplicate_listen(const char *scheme)
{
	nng_socket     s  = NNG_SOCKET_INITIALIZER;
	nng_listener   l1 = NNG_LISTENER_INITIALIZER;
	nng_listener   l2 = NNG_LISTENER_INITIALIZER;
	const char    *addr;
	const nng_url *url;

	NUTS_SKIP_IF_IPV6_NEEDED_AND_ABSENT(scheme);
	NUTS_ADDR_ZERO(addr, scheme);
	NUTS_OPEN(s);
	NUTS_PASS(nng_listen(s, addr, &l1, 0));
	NUTS_PASS(nng_listener_get_url(l1, &url));
	NUTS_FAIL(nng_listen_url(s, url, &l2, 0), NNG_EADDRINUSE);
	NUTS_TRUE(nng_listener_id(l1) > 0);
	NUTS_TRUE(nng_listener_id(l2) < 0);
	NUTS_CLOSE(s);
}